

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

Value * __thiscall
minja::MethodCallExpr::do_evaluate(MethodCallExpr *this,shared_ptr<minja::Context> *context)

{
  initializer_list<minja::Value> __l;
  bool bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  runtime_error *prVar5;
  long lVar6;
  size_t sVar7;
  size_type sVar8;
  ulong uVar9;
  ulong uVar10;
  undefined1 *puVar11;
  char *pcVar12;
  VariableExpr *this_00;
  long in_RSI;
  Value *in_RDI;
  size_t n;
  size_t i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> res;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> suffix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *part;
  iterator __end9;
  iterator __begin9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> sep;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> chars_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> chars_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> chars;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  Value callable;
  value_type key_1;
  Value *key;
  iterator __end5;
  iterator __begin5;
  vector<minja::Value,_std::allocator<minja::Value>_> *__range5;
  long index;
  ArgumentsValue vargs;
  Value obj;
  Value *result;
  VariableExpr *in_stack_fffffffffffff058;
  undefined7 in_stack_fffffffffffff060;
  _Alloc_hider in_stack_fffffffffffff067;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff068;
  vector<minja::Value,_std::allocator<minja::Value>_> *in_stack_fffffffffffff070;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff080;
  Value *in_stack_fffffffffffff088;
  Value *in_stack_fffffffffffff090;
  string *in_stack_fffffffffffff098;
  allocator<char> *__s;
  undefined7 in_stack_fffffffffffff0a0;
  undefined1 in_stack_fffffffffffff0a7;
  vector<minja::Value,_std::allocator<minja::Value>_> *in_stack_fffffffffffff0a8;
  Value *in_stack_fffffffffffff0b0;
  Value *in_stack_fffffffffffff0b8;
  Value *in_stack_fffffffffffff0c0;
  undefined7 in_stack_fffffffffffff0c8;
  undefined1 in_stack_fffffffffffff0cf;
  string *in_stack_fffffffffffff0d0;
  undefined6 in_stack_fffffffffffff0d8;
  undefined1 in_stack_fffffffffffff0de;
  undefined1 in_stack_fffffffffffff0df;
  Value *in_stack_fffffffffffff0e0;
  undefined7 in_stack_fffffffffffff0e8;
  undefined1 in_stack_fffffffffffff0ef;
  Value *in_stack_fffffffffffff0f0;
  undefined7 in_stack_fffffffffffff110;
  undefined1 in_stack_fffffffffffff117;
  Value *in_stack_fffffffffffff118;
  Value *in_stack_fffffffffffff138;
  undefined7 in_stack_fffffffffffff140;
  undefined1 in_stack_fffffffffffff147;
  Value *in_stack_fffffffffffff148;
  undefined8 ***local_e08;
  shared_ptr<minja::Context> *in_stack_fffffffffffff240;
  Expression *in_stack_fffffffffffff248;
  pair<unsigned_long,_unsigned_long> *in_stack_fffffffffffff268;
  pair<unsigned_long,_unsigned_long> *kw_count;
  undefined7 in_stack_fffffffffffff270;
  undefined1 in_stack_fffffffffffff277;
  string *in_stack_fffffffffffff278;
  string *method_name;
  undefined7 in_stack_fffffffffffff280;
  undefined1 in_stack_fffffffffffff287;
  Value *in_stack_fffffffffffff290;
  Value *in_stack_fffffffffffff298;
  string local_d20 [32];
  ulong local_d00;
  ulong local_cf8;
  string local_cf0 [32];
  int in_stack_fffffffffffff330;
  int in_stack_fffffffffffff334;
  ArgumentsExpression *in_stack_fffffffffffff338;
  int local_cb8 [2];
  pair<unsigned_long,_unsigned_long> local_cb0;
  allocator<char> local_c99;
  string local_c98 [32];
  string local_c78 [63];
  undefined1 local_c39;
  string local_c38 [32];
  int local_c18 [2];
  pair<unsigned_long,_unsigned_long> local_c10;
  int local_c00 [2];
  pair<unsigned_long,_unsigned_long> local_bf8;
  allocator<char> local_be1;
  string local_be0 [32];
  string local_bc0 [32];
  string local_ba0 [32];
  int local_b80 [2];
  pair<unsigned_long,_unsigned_long> local_b78;
  int local_b68 [2];
  pair<unsigned_long,_unsigned_long> local_b60;
  allocator<char> local_b49;
  string local_b48 [32];
  string local_b28 [112];
  reference local_ab8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_ab0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_aa8;
  undefined1 *local_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined8 local_a88;
  undefined1 local_a71;
  undefined1 local_a70 [24];
  string local_a58 [32];
  int local_a38 [2];
  pair<unsigned_long,_unsigned_long> local_a30;
  int local_a20 [2];
  pair<unsigned_long,_unsigned_long> local_a18;
  allocator<char> local_a01;
  string local_a00 [32];
  string local_9e0 [32];
  string local_9c0 [38];
  byte local_99a;
  allocator<char> local_999;
  string local_998 [32];
  int local_978 [2];
  pair<unsigned_long,_unsigned_long> local_970;
  int local_960 [2];
  pair<unsigned_long,_unsigned_long> local_958;
  allocator<char> local_941;
  string local_940 [32];
  string local_920 [32];
  string local_900 [38];
  byte local_8da;
  allocator<char> local_8d9;
  string local_8d8 [32];
  int local_8b8 [2];
  pair<unsigned_long,_unsigned_long> local_8b0;
  int local_8a0 [2];
  pair<unsigned_long,_unsigned_long> local_898;
  allocator<char> local_881;
  string local_880 [32];
  string local_860 [32];
  string local_840 [38];
  byte local_81a;
  allocator<char> local_819;
  string local_818 [32];
  int local_7f8 [2];
  pair<unsigned_long,_unsigned_long> local_7f0;
  int local_7e0 [2];
  pair<unsigned_long,_unsigned_long> local_7d8;
  allocator<char> local_7c1;
  string local_7c0 [32];
  string local_7a0 [32];
  string local_780 [39];
  undefined1 local_759;
  string local_718 [32];
  string local_6f8 [192];
  string local_638 [112];
  int local_5c8 [2];
  pair<unsigned_long,_unsigned_long> local_5c0;
  int local_5b0 [2];
  pair<unsigned_long,_unsigned_long> local_5a8;
  allocator<char> local_591;
  string local_590 [32];
  string local_570 [32];
  int local_550 [2];
  pair<unsigned_long,_unsigned_long> local_548;
  int local_538 [2];
  pair<unsigned_long,_unsigned_long> local_530;
  allocator<char> local_519;
  string local_518 [32];
  string local_4f8 [40];
  undefined1 ***local_4d0;
  undefined8 **local_4c8 [10];
  undefined1 local_478 [80];
  undefined1 ***local_428;
  undefined8 local_420;
  reference local_3b0;
  Value *local_3a8;
  __normal_iterator<minja::Value_*,_std::vector<minja::Value,_std::allocator<minja::Value>_>_>
  local_3a0;
  undefined1 local_398 [24];
  undefined1 *local_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined1 local_351;
  int local_350 [2];
  pair<unsigned_long,_unsigned_long> local_348;
  int local_338 [2];
  pair<unsigned_long,_unsigned_long> local_330;
  allocator<char> local_319;
  string local_318 [32];
  string local_2f8 [32];
  long local_2d8;
  int local_2d0 [2];
  pair<unsigned_long,_unsigned_long> local_2c8;
  int local_2b8 [2];
  pair<unsigned_long,_unsigned_long> local_2b0;
  allocator<char> local_299;
  string local_298 [32];
  string local_278 [112];
  int local_208 [2];
  pair<unsigned_long,_unsigned_long> local_200;
  int local_1f0 [2];
  pair<unsigned_long,_unsigned_long> local_1e8;
  undefined1 local_1d1 [33];
  string local_1b0 [36];
  int local_18c;
  int local_188 [2];
  pair<unsigned_long,_unsigned_long> local_180;
  int local_170 [2];
  pair<unsigned_long,_unsigned_long> local_168;
  undefined1 local_151 [33];
  string local_130 [39];
  undefined1 local_109;
  string local_c8 [32];
  vector<minja::Value,_std::allocator<minja::Value>_> local_a8 [7];
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x20));
  if (!bVar1) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,"MethodCallExpr.object is null");
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x30));
  if (!bVar1) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,"MethodCallExpr.method is null");
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__shared_ptr_access<minja::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<minja::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2fd8d3);
  Expression::evaluate(in_stack_fffffffffffff248,in_stack_fffffffffffff240);
  ArgumentsExpression::evaluate
            (in_stack_fffffffffffff338,
             (shared_ptr<minja::Context> *)
             CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330));
  bVar1 = Value::is_null((Value *)CONCAT17(in_stack_fffffffffffff067,in_stack_fffffffffffff060));
  if (bVar1) {
    local_109 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__shared_ptr_access<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x2fd94f);
    VariableExpr::get_name_abi_cxx11_(in_stack_fffffffffffff058);
    std::operator+((char *)in_stack_fffffffffffff068,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff067,in_stack_fffffffffffff060));
    std::operator+(in_stack_fffffffffffff068,
                   (char *)CONCAT17(in_stack_fffffffffffff067,in_stack_fffffffffffff060));
    std::runtime_error::runtime_error(prVar5,local_c8);
    local_109 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = Value::is_array((Value *)0x2fda9d);
  if (bVar1) {
    std::__shared_ptr_access<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x2fdab7);
    VariableExpr::get_name_abi_cxx11_(in_stack_fffffffffffff058);
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffff067,in_stack_fffffffffffff060),
                            (char *)in_stack_fffffffffffff058);
    std::__cxx11::string::~string(local_130);
    if ((bVar3 & 1) == 0) {
      std::__shared_ptr_access<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2fdc94);
      VariableExpr::get_name_abi_cxx11_(in_stack_fffffffffffff058);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_fffffffffffff067,in_stack_fffffffffffff060),
                              (char *)in_stack_fffffffffffff058);
      std::__cxx11::string::~string(local_1b0);
      if ((bVar2 & 1) == 0) {
        std::__shared_ptr_access<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2fdec1);
        VariableExpr::get_name_abi_cxx11_(in_stack_fffffffffffff058);
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_fffffffffffff067,in_stack_fffffffffffff060),
                                (char *)in_stack_fffffffffffff058);
        std::__cxx11::string::~string(local_278);
        if (!bVar1) goto LAB_0030045e;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff0a7,in_stack_fffffffffffff0a0),
                   (char *)in_stack_fffffffffffff098,(allocator<char> *)in_stack_fffffffffffff090);
        local_2b8[1] = 2;
        local_2b8[0] = 2;
        std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
                  (&local_2b0,local_2b8 + 1,local_2b8);
        local_2d0[1] = 0;
        local_2d0[0] = 0;
        std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
                  (&local_2c8,local_2d0 + 1,local_2d0);
        ArgumentsValue::expectArgs
                  ((ArgumentsValue *)CONCAT17(bVar3,in_stack_fffffffffffff280),
                   in_stack_fffffffffffff278,
                   (pair<unsigned_long,_unsigned_long> *)CONCAT17(bVar2,in_stack_fffffffffffff270),
                   in_stack_fffffffffffff268);
        std::__cxx11::string::~string(local_298);
        std::allocator<char>::~allocator(&local_299);
        std::vector<minja::Value,_std::allocator<minja::Value>_>::operator[](local_a8,0);
        lVar6 = Value::get<long>(in_stack_fffffffffffff0b0);
        local_2d8 = lVar6;
        if ((lVar6 < 0) ||
           (sVar7 = Value::size((Value *)CONCAT17(in_stack_fffffffffffff0df,
                                                  CONCAT16(in_stack_fffffffffffff0de,
                                                           in_stack_fffffffffffff0d8))),
           (long)sVar7 < lVar6)) {
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar5,"Index out of range for insert method");
          __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::vector<minja::Value,_std::allocator<minja::Value>_>::operator[](local_a8,1);
        Value::insert(in_stack_fffffffffffff0f0,
                      CONCAT17(in_stack_fffffffffffff0ef,in_stack_fffffffffffff0e8),
                      in_stack_fffffffffffff0e0);
        Value::Value((Value *)CONCAT17(in_stack_fffffffffffff067,in_stack_fffffffffffff060));
        local_18c = 1;
      }
      else {
        kw_count = (pair<unsigned_long,_unsigned_long> *)local_1d1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff0a7,in_stack_fffffffffffff0a0),
                   (char *)in_stack_fffffffffffff098,(allocator<char> *)in_stack_fffffffffffff090);
        local_1f0[1] = 0;
        local_1f0[0] = 1;
        std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
                  (&local_1e8,local_1f0 + 1,local_1f0);
        local_208[1] = 0;
        local_208[0] = 0;
        std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
                  (&local_200,local_208 + 1,local_208);
        ArgumentsValue::expectArgs
                  ((ArgumentsValue *)CONCAT17(bVar3,in_stack_fffffffffffff280),
                   in_stack_fffffffffffff278,
                   (pair<unsigned_long,_unsigned_long> *)CONCAT17(bVar2,in_stack_fffffffffffff270),
                   kw_count);
        std::__cxx11::string::~string((string *)(local_1d1 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_1d1);
        bVar1 = std::vector<minja::Value,_std::allocator<minja::Value>_>::empty
                          (in_stack_fffffffffffff070);
        if (bVar1) {
          Value::Value((Value *)CONCAT17(in_stack_fffffffffffff067,in_stack_fffffffffffff060));
        }
        else {
          std::vector<minja::Value,_std::allocator<minja::Value>_>::operator[](local_a8,0);
          Value::Value(in_stack_fffffffffffff090,in_stack_fffffffffffff088);
        }
        Value::pop(in_stack_fffffffffffff298,in_stack_fffffffffffff290);
        Value::~Value((Value *)CONCAT17(in_stack_fffffffffffff067,in_stack_fffffffffffff060));
        local_18c = 1;
      }
    }
    else {
      method_name = (string *)local_151;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff0a7,in_stack_fffffffffffff0a0),
                 (char *)in_stack_fffffffffffff098,(allocator<char> *)in_stack_fffffffffffff090);
      local_170[1] = 1;
      local_170[0] = 1;
      std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
                (&local_168,local_170 + 1,local_170);
      local_188[1] = 0;
      local_188[0] = 0;
      std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
                (&local_180,local_188 + 1,local_188);
      ArgumentsValue::expectArgs
                ((ArgumentsValue *)CONCAT17(bVar3,in_stack_fffffffffffff280),method_name,
                 (pair<unsigned_long,_unsigned_long> *)
                 CONCAT17(in_stack_fffffffffffff277,in_stack_fffffffffffff270),
                 in_stack_fffffffffffff268);
      std::__cxx11::string::~string((string *)(local_151 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_151);
      std::vector<minja::Value,_std::allocator<minja::Value>_>::operator[](local_a8,0);
      Value::push_back(in_stack_fffffffffffff0c0,in_stack_fffffffffffff0b8);
      Value::Value((Value *)CONCAT17(in_stack_fffffffffffff067,in_stack_fffffffffffff060));
      local_18c = 1;
    }
  }
  else {
    bVar1 = Value::is_object((Value *)0x2fe18d);
    if (!bVar1) {
      bVar1 = Value::is_string((Value *)0x2fef55);
      if (bVar1) {
        Value::get<std::__cxx11::string>
                  ((Value *)CONCAT17(in_stack_fffffffffffff0cf,in_stack_fffffffffffff0c8));
        std::__shared_ptr_access<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2fef86);
        VariableExpr::get_name_abi_cxx11_(in_stack_fffffffffffff058);
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_fffffffffffff067,in_stack_fffffffffffff060),
                                (char *)in_stack_fffffffffffff058);
        std::__cxx11::string::~string(local_7a0);
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff0a7,in_stack_fffffffffffff0a0),
                     (char *)in_stack_fffffffffffff098,(allocator<char> *)in_stack_fffffffffffff090)
          ;
          local_7e0[1] = 0;
          local_7e0[0] = 1;
          std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
                    (&local_7d8,local_7e0 + 1,local_7e0);
          local_7f8[1] = 0;
          local_7f8[0] = 0;
          std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
                    (&local_7f0,local_7f8 + 1,local_7f8);
          ArgumentsValue::expectArgs
                    ((ArgumentsValue *)CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280)
                     ,in_stack_fffffffffffff278,
                     (pair<unsigned_long,_unsigned_long> *)
                     CONCAT17(in_stack_fffffffffffff277,in_stack_fffffffffffff270),
                     in_stack_fffffffffffff268);
          std::__cxx11::string::~string(local_7c0);
          std::allocator<char>::~allocator(&local_7c1);
          bVar1 = std::vector<minja::Value,_std::allocator<minja::Value>_>::empty
                            (in_stack_fffffffffffff070);
          local_81a = 0;
          if (bVar1) {
            std::allocator<char>::allocator();
            local_81a = 1;
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffff0a7,in_stack_fffffffffffff0a0),
                       (char *)in_stack_fffffffffffff098,
                       (allocator<char> *)in_stack_fffffffffffff090);
          }
          else {
            std::vector<minja::Value,_std::allocator<minja::Value>_>::operator[](local_a8,0);
            Value::get<std::__cxx11::string>
                      ((Value *)CONCAT17(in_stack_fffffffffffff0cf,in_stack_fffffffffffff0c8));
          }
          if ((local_81a & 1) != 0) {
            std::allocator<char>::~allocator(&local_819);
          }
          strip((string *)CONCAT17(in_stack_fffffffffffff0ef,in_stack_fffffffffffff0e8),
                (string *)in_stack_fffffffffffff0e0,(bool)in_stack_fffffffffffff0df,
                (bool)in_stack_fffffffffffff0de);
          Value::Value(in_stack_fffffffffffff090,(string *)in_stack_fffffffffffff088);
          std::__cxx11::string::~string(local_840);
          local_18c = 1;
          std::__cxx11::string::~string(local_818);
        }
        else {
          std::__shared_ptr_access<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x2ff29b);
          VariableExpr::get_name_abi_cxx11_(in_stack_fffffffffffff058);
          bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(in_stack_fffffffffffff067,in_stack_fffffffffffff060),
                                  (char *)in_stack_fffffffffffff058);
          std::__cxx11::string::~string(local_860);
          if ((bVar3 & 1) == 0) {
            std::__shared_ptr_access<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2ff596);
            VariableExpr::get_name_abi_cxx11_(in_stack_fffffffffffff058);
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT17(in_stack_fffffffffffff067,in_stack_fffffffffffff060)
                                    ,(char *)in_stack_fffffffffffff058);
            std::__cxx11::string::~string(local_920);
            if (bVar1) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffff0a7,in_stack_fffffffffffff0a0),
                         (char *)in_stack_fffffffffffff098,
                         (allocator<char> *)in_stack_fffffffffffff090);
              local_960[1] = 0;
              local_960[0] = 1;
              std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
                        (&local_958,local_960 + 1,local_960);
              local_978[1] = 0;
              local_978[0] = 0;
              std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
                        (&local_970,local_978 + 1,local_978);
              ArgumentsValue::expectArgs
                        ((ArgumentsValue *)
                         CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                         in_stack_fffffffffffff278,
                         (pair<unsigned_long,_unsigned_long> *)
                         CONCAT17(in_stack_fffffffffffff277,in_stack_fffffffffffff270),
                         in_stack_fffffffffffff268);
              std::__cxx11::string::~string(local_940);
              std::allocator<char>::~allocator(&local_941);
              bVar1 = std::vector<minja::Value,_std::allocator<minja::Value>_>::empty
                                (in_stack_fffffffffffff070);
              local_99a = 0;
              if (bVar1) {
                std::allocator<char>::allocator();
                local_99a = 1;
                std::__cxx11::string::string<std::allocator<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffff0a7,in_stack_fffffffffffff0a0),
                           (char *)in_stack_fffffffffffff098,
                           (allocator<char> *)in_stack_fffffffffffff090);
              }
              else {
                std::vector<minja::Value,_std::allocator<minja::Value>_>::operator[](local_a8,0);
                Value::get<std::__cxx11::string>
                          ((Value *)CONCAT17(in_stack_fffffffffffff0cf,in_stack_fffffffffffff0c8));
              }
              if ((local_99a & 1) != 0) {
                std::allocator<char>::~allocator(&local_999);
              }
              strip((string *)CONCAT17(in_stack_fffffffffffff0ef,in_stack_fffffffffffff0e8),
                    (string *)in_stack_fffffffffffff0e0,(bool)in_stack_fffffffffffff0df,
                    (bool)in_stack_fffffffffffff0de);
              Value::Value(in_stack_fffffffffffff090,(string *)in_stack_fffffffffffff088);
              std::__cxx11::string::~string(local_9c0);
              local_18c = 1;
              std::__cxx11::string::~string(local_998);
            }
            else {
              std::
              __shared_ptr_access<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2ff891);
              VariableExpr::get_name_abi_cxx11_(in_stack_fffffffffffff058);
              bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT17(in_stack_fffffffffffff067,
                                                  in_stack_fffffffffffff060),
                                      (char *)in_stack_fffffffffffff058);
              std::__cxx11::string::~string(local_9e0);
              if ((bVar3 & 1) == 0) {
                std::
                __shared_ptr_access<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x2ffc51);
                VariableExpr::get_name_abi_cxx11_(in_stack_fffffffffffff058);
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT17(in_stack_fffffffffffff067,
                                                    in_stack_fffffffffffff060),
                                        (char *)in_stack_fffffffffffff058);
                std::__cxx11::string::~string(local_b28);
                if (bVar1) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_fffffffffffff0a7,in_stack_fffffffffffff0a0),
                             (char *)in_stack_fffffffffffff098,
                             (allocator<char> *)in_stack_fffffffffffff090);
                  local_b68[1] = 0;
                  local_b68[0] = 0;
                  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
                            (&local_b60,local_b68 + 1,local_b68);
                  local_b80[1] = 0;
                  local_b80[0] = 0;
                  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
                            (&local_b78,local_b80 + 1,local_b80);
                  ArgumentsValue::expectArgs
                            ((ArgumentsValue *)
                             CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                             in_stack_fffffffffffff278,
                             (pair<unsigned_long,_unsigned_long> *)
                             CONCAT17(in_stack_fffffffffffff277,in_stack_fffffffffffff270),
                             in_stack_fffffffffffff268);
                  std::__cxx11::string::~string(local_b48);
                  std::allocator<char>::~allocator(&local_b49);
                  capitalize(in_stack_fffffffffffff098);
                  Value::Value(in_stack_fffffffffffff090,(string *)in_stack_fffffffffffff088);
                  std::__cxx11::string::~string(local_ba0);
                  local_18c = 1;
                }
                else {
                  std::
                  __shared_ptr_access<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x2ffe44);
                  VariableExpr::get_name_abi_cxx11_(in_stack_fffffffffffff058);
                  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)CONCAT17(in_stack_fffffffffffff067,
                                                      in_stack_fffffffffffff060),
                                          (char *)in_stack_fffffffffffff058);
                  std::__cxx11::string::~string(local_bc0);
                  if ((bVar3 & 1) == 0) {
                    std::
                    __shared_ptr_access<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x3000ff);
                    VariableExpr::get_name_abi_cxx11_(in_stack_fffffffffffff058);
                    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)CONCAT17(in_stack_fffffffffffff067,
                                                        in_stack_fffffffffffff060),
                                            (char *)in_stack_fffffffffffff058);
                    std::__cxx11::string::~string(local_c78);
                    if ((bVar3 & 1) == 0) {
                      local_18c = 0;
                    }
                    else {
                      __s = &local_c99;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT17(bVar3,in_stack_fffffffffffff0a0),(char *)__s,
                                 (allocator<char> *)in_stack_fffffffffffff090);
                      local_cb8[1] = 0;
                      local_cb8[0] = 0;
                      std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
                                (&local_cb0,local_cb8 + 1,local_cb8);
                      std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
                                ((pair<unsigned_long,_unsigned_long> *)&stack0xfffffffffffff338,
                                 (int *)&stack0xfffffffffffff334,(int *)&stack0xfffffffffffff330);
                      ArgumentsValue::expectArgs
                                ((ArgumentsValue *)
                                 CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                                 in_stack_fffffffffffff278,
                                 (pair<unsigned_long,_unsigned_long> *)
                                 CONCAT17(in_stack_fffffffffffff277,in_stack_fffffffffffff270),
                                 in_stack_fffffffffffff268);
                      std::__cxx11::string::~string(local_c98);
                      std::allocator<char>::~allocator(&local_c99);
                      std::__cxx11::string::string(local_cf0,local_780);
                      local_cf8 = 0;
                      local_d00 = std::__cxx11::string::size();
                      for (; local_cf8 < local_d00; local_cf8 = local_cf8 + 1) {
                        if (local_cf8 == 0) {
LAB_003002a9:
                          in_stack_fffffffffffff088 =
                               (Value *)std::__cxx11::string::operator[]((ulong)local_cf0);
                          iVar4 = toupper((int)*(char *)&(in_stack_fffffffffffff088->
                                                         super_enable_shared_from_this<minja::Value>
                                                         )._M_weak_this.
                                                                                                                  
                                                  super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr);
                          puVar11 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_cf0)
                          ;
                          *puVar11 = (char)iVar4;
                        }
                        else {
                          in_stack_fffffffffffff090 =
                               (Value *)std::__cxx11::string::operator[]((ulong)local_cf0);
                          iVar4 = isspace((int)*(char *)&(in_stack_fffffffffffff090->
                                                         super_enable_shared_from_this<minja::Value>
                                                         )._M_weak_this.
                                                                                                                  
                                                  super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr);
                          if (iVar4 != 0) goto LAB_003002a9;
                          pcVar12 = (char *)std::__cxx11::string::operator[]((ulong)local_cf0);
                          iVar4 = tolower((int)*pcVar12);
                          in_stack_fffffffffffff067 = SUB41(iVar4,0);
                          in_stack_fffffffffffff068 =
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               std::__cxx11::string::operator[]((ulong)local_cf0);
                          in_stack_fffffffffffff068->_M_dataplus = in_stack_fffffffffffff067;
                        }
                      }
                      Value::Value(in_stack_fffffffffffff090,(string *)in_stack_fffffffffffff088);
                      local_18c = 1;
                      std::__cxx11::string::~string(local_cf0);
                    }
                  }
                  else {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(in_stack_fffffffffffff0a7,in_stack_fffffffffffff0a0),
                               (char *)in_stack_fffffffffffff098,
                               (allocator<char> *)in_stack_fffffffffffff090);
                    local_c00[1] = 1;
                    local_c00[0] = 1;
                    std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
                              (&local_bf8,local_c00 + 1,local_c00);
                    local_c18[1] = 0;
                    local_c18[0] = 0;
                    std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
                              (&local_c10,local_c18 + 1,local_c18);
                    ArgumentsValue::expectArgs
                              ((ArgumentsValue *)
                               CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                               in_stack_fffffffffffff278,
                               (pair<unsigned_long,_unsigned_long> *)
                               CONCAT17(in_stack_fffffffffffff277,in_stack_fffffffffffff270),
                               in_stack_fffffffffffff268);
                    std::__cxx11::string::~string(local_be0);
                    std::allocator<char>::~allocator(&local_be1);
                    std::vector<minja::Value,_std::allocator<minja::Value>_>::operator[](local_a8,0)
                    ;
                    Value::get<std::__cxx11::string>
                              ((Value *)CONCAT17(in_stack_fffffffffffff0cf,in_stack_fffffffffffff0c8
                                                ));
                    uVar9 = std::__cxx11::string::length();
                    uVar10 = std::__cxx11::string::length();
                    local_c39 = false;
                    if (uVar9 <= uVar10) {
                      std::__cxx11::string::rbegin();
                      std::__cxx11::string::rend();
                      std::__cxx11::string::rbegin();
                      local_c39 = std::
                                  equal<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>>
                                            ((reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              *)in_stack_fffffffffffff090,
                                             (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              *)in_stack_fffffffffffff088,in_stack_fffffffffffff080)
                      ;
                    }
                    Value::Value((Value *)CONCAT17(in_stack_fffffffffffff067,
                                                   in_stack_fffffffffffff060),
                                 (bool *)in_stack_fffffffffffff058);
                    local_18c = 1;
                    std::__cxx11::string::~string(local_c38);
                  }
                }
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffff0a7,in_stack_fffffffffffff0a0),
                           (char *)in_stack_fffffffffffff098,
                           (allocator<char> *)in_stack_fffffffffffff090);
                local_a20[1] = 1;
                local_a20[0] = 1;
                std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
                          (&local_a18,local_a20 + 1,local_a20);
                local_a38[1] = 0;
                local_a38[0] = 0;
                std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
                          (&local_a30,local_a38 + 1,local_a38);
                ArgumentsValue::expectArgs
                          ((ArgumentsValue *)
                           CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                           in_stack_fffffffffffff278,
                           (pair<unsigned_long,_unsigned_long> *)
                           CONCAT17(in_stack_fffffffffffff277,in_stack_fffffffffffff270),
                           in_stack_fffffffffffff268);
                std::__cxx11::string::~string(local_a00);
                std::allocator<char>::~allocator(&local_a01);
                std::vector<minja::Value,_std::allocator<minja::Value>_>::operator[](local_a8,0);
                Value::get<std::__cxx11::string>
                          ((Value *)CONCAT17(in_stack_fffffffffffff0cf,in_stack_fffffffffffff0c8));
                split((string *)
                      CONCAT17(in_stack_fffffffffffff0df,
                               CONCAT16(in_stack_fffffffffffff0de,in_stack_fffffffffffff0d8)),
                      in_stack_fffffffffffff0d0);
                local_a71 = 0;
                local_a98 = 0;
                uStack_a90 = 0;
                local_a88 = 0;
                std::vector<minja::Value,_std::allocator<minja::Value>_>::vector
                          ((vector<minja::Value,_std::allocator<minja::Value>_> *)0x2ffa2f);
                Value::array(in_stack_fffffffffffff0a8);
                std::vector<minja::Value,_std::allocator<minja::Value>_>::~vector
                          (in_stack_fffffffffffff070);
                local_aa0 = local_a70;
                local_aa8._M_current =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)in_stack_fffffffffffff058);
                local_ab0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)in_stack_fffffffffffff058);
                while (bVar1 = __gnu_cxx::operator!=
                                         ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)CONCAT17(in_stack_fffffffffffff067,
                                                      in_stack_fffffffffffff060),
                                          (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)in_stack_fffffffffffff058), bVar1) {
                  local_ab8 = __gnu_cxx::
                              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ::operator*(&local_aa8);
                  Value::Value(in_stack_fffffffffffff090,(string *)in_stack_fffffffffffff088);
                  Value::push_back(in_stack_fffffffffffff0c0,in_stack_fffffffffffff0b8);
                  Value::~Value((Value *)CONCAT17(in_stack_fffffffffffff067,
                                                  in_stack_fffffffffffff060));
                  __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator++(&local_aa8);
                }
                local_18c = 1;
                local_a71 = 1;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffff070);
                std::__cxx11::string::~string(local_a58);
              }
            }
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffff0a7,in_stack_fffffffffffff0a0),
                       (char *)in_stack_fffffffffffff098,
                       (allocator<char> *)in_stack_fffffffffffff090);
            local_8a0[1] = 0;
            local_8a0[0] = 1;
            std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
                      (&local_898,local_8a0 + 1,local_8a0);
            local_8b8[1] = 0;
            local_8b8[0] = 0;
            std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
                      (&local_8b0,local_8b8 + 1,local_8b8);
            ArgumentsValue::expectArgs
                      ((ArgumentsValue *)
                       CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                       in_stack_fffffffffffff278,
                       (pair<unsigned_long,_unsigned_long> *)
                       CONCAT17(in_stack_fffffffffffff277,in_stack_fffffffffffff270),
                       in_stack_fffffffffffff268);
            std::__cxx11::string::~string(local_880);
            std::allocator<char>::~allocator(&local_881);
            bVar1 = std::vector<minja::Value,_std::allocator<minja::Value>_>::empty
                              (in_stack_fffffffffffff070);
            local_8da = 0;
            if (bVar1) {
              std::allocator<char>::allocator();
              local_8da = 1;
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffff0a7,in_stack_fffffffffffff0a0),
                         (char *)in_stack_fffffffffffff098,
                         (allocator<char> *)in_stack_fffffffffffff090);
            }
            else {
              std::vector<minja::Value,_std::allocator<minja::Value>_>::operator[](local_a8,0);
              Value::get<std::__cxx11::string>
                        ((Value *)CONCAT17(in_stack_fffffffffffff0cf,in_stack_fffffffffffff0c8));
            }
            if ((local_8da & 1) != 0) {
              std::allocator<char>::~allocator(&local_8d9);
            }
            strip((string *)CONCAT17(in_stack_fffffffffffff0ef,in_stack_fffffffffffff0e8),
                  (string *)in_stack_fffffffffffff0e0,(bool)in_stack_fffffffffffff0df,
                  (bool)in_stack_fffffffffffff0de);
            Value::Value(in_stack_fffffffffffff090,(string *)in_stack_fffffffffffff088);
            std::__cxx11::string::~string(local_900);
            local_18c = 1;
            std::__cxx11::string::~string(local_8d8);
          }
        }
        std::__cxx11::string::~string(local_780);
        if (local_18c != 0) goto LAB_0030055d;
      }
LAB_0030045e:
      this_00 = (VariableExpr *)__cxa_allocate_exception(0x10);
      std::__shared_ptr_access<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x300485);
      VariableExpr::get_name_abi_cxx11_(this_00);
      std::operator+((char *)in_stack_fffffffffffff068,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff067,in_stack_fffffffffffff060));
      std::runtime_error::runtime_error((runtime_error *)this_00,local_d20);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__shared_ptr_access<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x2fe1a7);
    VariableExpr::get_name_abi_cxx11_(in_stack_fffffffffffff058);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffff067,in_stack_fffffffffffff060),
                            (char *)in_stack_fffffffffffff058);
    std::__cxx11::string::~string(local_2f8);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff0a7,in_stack_fffffffffffff0a0),
                 (char *)in_stack_fffffffffffff098,(allocator<char> *)in_stack_fffffffffffff090);
      local_338[1] = 0;
      local_338[0] = 0;
      std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
                (&local_330,local_338 + 1,local_338);
      local_350[1] = 0;
      local_350[0] = 0;
      std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
                (&local_348,local_350 + 1,local_350);
      ArgumentsValue::expectArgs
                ((ArgumentsValue *)CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                 in_stack_fffffffffffff278,
                 (pair<unsigned_long,_unsigned_long> *)
                 CONCAT17(in_stack_fffffffffffff277,in_stack_fffffffffffff270),
                 in_stack_fffffffffffff268);
      std::__cxx11::string::~string(local_318);
      std::allocator<char>::~allocator(&local_319);
      local_351 = 0;
      local_378 = 0;
      uStack_370 = 0;
      local_368 = 0;
      std::vector<minja::Value,_std::allocator<minja::Value>_>::vector
                ((vector<minja::Value,_std::allocator<minja::Value>_> *)0x2fe303);
      Value::array(in_stack_fffffffffffff0a8);
      std::vector<minja::Value,_std::allocator<minja::Value>_>::~vector(in_stack_fffffffffffff070);
      Value::keys(in_stack_fffffffffffff138);
      local_380 = local_398;
      local_3a0._M_current =
           (Value *)std::vector<minja::Value,_std::allocator<minja::Value>_>::begin
                              ((vector<minja::Value,_std::allocator<minja::Value>_> *)
                               in_stack_fffffffffffff058);
      local_3a8 = (Value *)std::vector<minja::Value,_std::allocator<minja::Value>_>::end
                                     ((vector<minja::Value,_std::allocator<minja::Value>_> *)
                                      in_stack_fffffffffffff058);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<minja::Value_*,_std::vector<minja::Value,_std::allocator<minja::Value>_>_>
                                 *)CONCAT17(in_stack_fffffffffffff067,in_stack_fffffffffffff060),
                                (__normal_iterator<minja::Value_*,_std::vector<minja::Value,_std::allocator<minja::Value>_>_>
                                 *)in_stack_fffffffffffff058), bVar1) {
        local_3b0 = __gnu_cxx::
                    __normal_iterator<minja::Value_*,_std::vector<minja::Value,_std::allocator<minja::Value>_>_>
                    ::operator*(&local_3a0);
        local_4d0 = (undefined1 ***)local_4c8;
        Value::Value(in_stack_fffffffffffff090,in_stack_fffffffffffff088);
        local_4d0 = (undefined1 ***)local_478;
        Value::at(in_stack_fffffffffffff118,
                  (Value *)CONCAT17(in_stack_fffffffffffff117,in_stack_fffffffffffff110));
        Value::Value(in_stack_fffffffffffff090,in_stack_fffffffffffff088);
        local_428 = (undefined1 ***)local_4c8;
        local_420 = 2;
        std::allocator<minja::Value>::allocator((allocator<minja::Value> *)0x2fe4ed);
        __l._M_len._0_7_ = in_stack_fffffffffffff0a0;
        __l._M_array = (iterator)in_stack_fffffffffffff098;
        __l._M_len._7_1_ = in_stack_fffffffffffff0a7;
        std::vector<minja::Value,_std::allocator<minja::Value>_>::vector
                  ((vector<minja::Value,_std::allocator<minja::Value>_> *)in_stack_fffffffffffff090,
                   __l,(allocator_type *)in_stack_fffffffffffff088);
        Value::array(in_stack_fffffffffffff0a8);
        Value::push_back(in_stack_fffffffffffff0c0,in_stack_fffffffffffff0b8);
        Value::~Value((Value *)CONCAT17(in_stack_fffffffffffff067,in_stack_fffffffffffff060));
        std::vector<minja::Value,_std::allocator<minja::Value>_>::~vector(in_stack_fffffffffffff070)
        ;
        std::allocator<minja::Value>::~allocator((allocator<minja::Value> *)0x2fe569);
        local_e08 = &local_428;
        do {
          local_e08 = local_e08 + -10;
          Value::~Value((Value *)CONCAT17(in_stack_fffffffffffff067,in_stack_fffffffffffff060));
        } while (local_e08 != local_4c8);
        __gnu_cxx::
        __normal_iterator<minja::Value_*,_std::vector<minja::Value,_std::allocator<minja::Value>_>_>
        ::operator++(&local_3a0);
      }
      local_18c = 2;
      std::vector<minja::Value,_std::allocator<minja::Value>_>::~vector(in_stack_fffffffffffff070);
      local_18c = 1;
      local_351 = 1;
    }
    else {
      std::__shared_ptr_access<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2fe75b);
      VariableExpr::get_name_abi_cxx11_(in_stack_fffffffffffff058);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_fffffffffffff067,in_stack_fffffffffffff060),
                              (char *)in_stack_fffffffffffff058);
      std::__cxx11::string::~string(local_4f8);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff0a7,in_stack_fffffffffffff0a0),
                   (char *)in_stack_fffffffffffff098,(allocator<char> *)in_stack_fffffffffffff090);
        local_538[1] = 1;
        local_538[0] = 1;
        std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
                  (&local_530,local_538 + 1,local_538);
        local_550[1] = 0;
        local_550[0] = 0;
        std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
                  (&local_548,local_550 + 1,local_550);
        ArgumentsValue::expectArgs
                  ((ArgumentsValue *)CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                   in_stack_fffffffffffff278,
                   (pair<unsigned_long,_unsigned_long> *)
                   CONCAT17(in_stack_fffffffffffff277,in_stack_fffffffffffff270),
                   in_stack_fffffffffffff268);
        std::__cxx11::string::~string(local_518);
        std::allocator<char>::~allocator(&local_519);
        std::vector<minja::Value,_std::allocator<minja::Value>_>::operator[](local_a8,0);
        Value::pop(in_stack_fffffffffffff298,in_stack_fffffffffffff290);
        local_18c = 1;
      }
      else {
        std::__shared_ptr_access<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2fe918);
        VariableExpr::get_name_abi_cxx11_(in_stack_fffffffffffff058);
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_fffffffffffff067,in_stack_fffffffffffff060),
                                (char *)in_stack_fffffffffffff058);
        std::__cxx11::string::~string(local_570);
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff0a7,in_stack_fffffffffffff0a0),
                     (char *)in_stack_fffffffffffff098,(allocator<char> *)in_stack_fffffffffffff090)
          ;
          local_5b0[1] = 1;
          local_5b0[0] = 2;
          std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
                    (&local_5a8,local_5b0 + 1,local_5b0);
          local_5c8[1] = 0;
          local_5c8[0] = 0;
          std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
                    (&local_5c0,local_5c8 + 1,local_5c8);
          ArgumentsValue::expectArgs
                    ((ArgumentsValue *)CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280)
                     ,in_stack_fffffffffffff278,
                     (pair<unsigned_long,_unsigned_long> *)
                     CONCAT17(in_stack_fffffffffffff277,in_stack_fffffffffffff270),
                     in_stack_fffffffffffff268);
          std::__cxx11::string::~string(local_590);
          std::allocator<char>::~allocator(&local_591);
          std::vector<minja::Value,_std::allocator<minja::Value>_>::operator[](local_a8,0);
          Value::Value(in_stack_fffffffffffff090,in_stack_fffffffffffff088);
          sVar8 = std::vector<minja::Value,_std::allocator<minja::Value>_>::size(local_a8);
          if (sVar8 == 1) {
            bVar1 = Value::contains(in_stack_fffffffffffff148,
                                    (Value *)CONCAT17(in_stack_fffffffffffff147,
                                                      in_stack_fffffffffffff140));
            if (bVar1) {
              Value::at(in_stack_fffffffffffff118,
                        (Value *)CONCAT17(in_stack_fffffffffffff117,in_stack_fffffffffffff110));
              Value::Value(in_stack_fffffffffffff090,in_stack_fffffffffffff088);
            }
            else {
              Value::Value((Value *)CONCAT17(in_stack_fffffffffffff067,in_stack_fffffffffffff060));
            }
          }
          else {
            bVar1 = Value::contains(in_stack_fffffffffffff148,
                                    (Value *)CONCAT17(in_stack_fffffffffffff147,
                                                      in_stack_fffffffffffff140));
            if (bVar1) {
              Value::at(in_stack_fffffffffffff118,
                        (Value *)CONCAT17(in_stack_fffffffffffff117,in_stack_fffffffffffff110));
            }
            else {
              std::vector<minja::Value,_std::allocator<minja::Value>_>::operator[](local_a8,1);
            }
            Value::Value(in_stack_fffffffffffff090,in_stack_fffffffffffff088);
          }
          local_18c = 1;
          Value::~Value((Value *)CONCAT17(in_stack_fffffffffffff067,in_stack_fffffffffffff060));
        }
        else {
          std::__shared_ptr_access<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x2fec28);
          VariableExpr::get_name_abi_cxx11_(in_stack_fffffffffffff058);
          bVar1 = Value::contains((Value *)CONCAT17(in_stack_fffffffffffff0cf,
                                                    in_stack_fffffffffffff0c8),
                                  (string *)in_stack_fffffffffffff0c0);
          std::__cxx11::string::~string(local_638);
          if (!bVar1) goto LAB_0030045e;
          std::__shared_ptr_access<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x2fec86);
          VariableExpr::get_name_abi_cxx11_(in_stack_fffffffffffff058);
          Value::Value(in_stack_fffffffffffff090,(string *)in_stack_fffffffffffff088);
          Value::at(in_stack_fffffffffffff118,
                    (Value *)CONCAT17(in_stack_fffffffffffff117,in_stack_fffffffffffff110));
          Value::Value(in_stack_fffffffffffff090,in_stack_fffffffffffff088);
          Value::~Value((Value *)CONCAT17(in_stack_fffffffffffff067,in_stack_fffffffffffff060));
          std::__cxx11::string::~string(local_6f8);
          bVar1 = Value::is_callable((Value *)0x2fed0c);
          if (!bVar1) {
            local_759 = 1;
            prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__shared_ptr_access<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2fed3f);
            VariableExpr::get_name_abi_cxx11_(in_stack_fffffffffffff058);
            std::operator+((char *)in_stack_fffffffffffff068,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffff067,in_stack_fffffffffffff060));
            std::operator+(in_stack_fffffffffffff068,
                           (char *)CONCAT17(in_stack_fffffffffffff067,in_stack_fffffffffffff060));
            std::runtime_error::runtime_error(prVar5,local_718);
            local_759 = 0;
            __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          Value::call((Value *)CONCAT17(in_stack_fffffffffffff0df,
                                        CONCAT16(in_stack_fffffffffffff0de,in_stack_fffffffffffff0d8
                                                )),
                      (shared_ptr<minja::Context> *)in_stack_fffffffffffff0d0,
                      (ArgumentsValue *)
                      CONCAT17(in_stack_fffffffffffff0cf,in_stack_fffffffffffff0c8));
          local_18c = 1;
          Value::~Value((Value *)CONCAT17(in_stack_fffffffffffff067,in_stack_fffffffffffff060));
        }
      }
    }
  }
LAB_0030055d:
  ArgumentsValue::~ArgumentsValue
            ((ArgumentsValue *)CONCAT17(in_stack_fffffffffffff067,in_stack_fffffffffffff060));
  Value::~Value((Value *)CONCAT17(in_stack_fffffffffffff067,in_stack_fffffffffffff060));
  return in_RDI;
}

Assistant:

Value do_evaluate(const std::shared_ptr<Context> & context) const override {
        if (!object) throw std::runtime_error("MethodCallExpr.object is null");
        if (!method) throw std::runtime_error("MethodCallExpr.method is null");
        auto obj = object->evaluate(context);
        auto vargs = args.evaluate(context);
        if (obj.is_null()) {
          throw std::runtime_error("Trying to call method '" + method->get_name() + "' on null");
        }
        if (obj.is_array()) {
          if (method->get_name() == "append") {
              vargs.expectArgs("append method", {1, 1}, {0, 0});
              obj.push_back(vargs.args[0]);
              return Value();
          } else if (method->get_name() == "pop") {
              vargs.expectArgs("pop method", {0, 1}, {0, 0});
              return obj.pop(vargs.args.empty() ? Value() : vargs.args[0]);
          } else if (method->get_name() == "insert") {
              vargs.expectArgs("insert method", {2, 2}, {0, 0});
              auto index = vargs.args[0].get<int64_t>();
              if (index < 0 || index > (int64_t) obj.size()) throw std::runtime_error("Index out of range for insert method");
              obj.insert(index, vargs.args[1]);
              return Value();
          }
        } else if (obj.is_object()) {
          if (method->get_name() == "items") {
            vargs.expectArgs("items method", {0, 0}, {0, 0});
            auto result = Value::array();
            for (const auto& key : obj.keys()) {
              result.push_back(Value::array({key, obj.at(key)}));
            }
            return result;
          } else if (method->get_name() == "pop") {
            vargs.expectArgs("pop method", {1, 1}, {0, 0});
            return obj.pop(vargs.args[0]);
          } else if (method->get_name() == "get") {
            vargs.expectArgs("get method", {1, 2}, {0, 0});
            auto key = vargs.args[0];
            if (vargs.args.size() == 1) {
              return obj.contains(key) ? obj.at(key) : Value();
            } else {
              return obj.contains(key) ? obj.at(key) : vargs.args[1];
            }
          } else if (obj.contains(method->get_name())) {
            auto callable = obj.at(method->get_name());
            if (!callable.is_callable()) {
              throw std::runtime_error("Property '" + method->get_name() + "' is not callable");
            }
            return callable.call(context, vargs);
          }
        } else if (obj.is_string()) {
          auto str = obj.get<std::string>();
          if (method->get_name() == "strip") {
            vargs.expectArgs("strip method", {0, 1}, {0, 0});
            auto chars = vargs.args.empty() ? "" : vargs.args[0].get<std::string>();
            return Value(strip(str, chars));
          } else if (method->get_name() == "lstrip") {
            vargs.expectArgs("lstrip method", {0, 1}, {0, 0});
            auto chars = vargs.args.empty() ? "" : vargs.args[0].get<std::string>();
            return Value(strip(str, chars, /* left= */ true, /* right= */ false));
          } else if (method->get_name() == "rstrip") {
            vargs.expectArgs("rstrip method", {0, 1}, {0, 0});
            auto chars = vargs.args.empty() ? "" : vargs.args[0].get<std::string>();
            return Value(strip(str, chars, /* left= */ false, /* right= */ true));
          } else if (method->get_name() == "split") {
            vargs.expectArgs("split method", {1, 1}, {0, 0});
            auto sep = vargs.args[0].get<std::string>();
            auto parts = split(str, sep);
            Value result = Value::array();
            for (const auto& part : parts) {
              result.push_back(Value(part));
            }
            return result;
          } else if (method->get_name() == "capitalize") {
            vargs.expectArgs("capitalize method", {0, 0}, {0, 0});
            return Value(capitalize(str));
          } else if (method->get_name() == "endswith") {
            vargs.expectArgs("endswith method", {1, 1}, {0, 0});
            auto suffix = vargs.args[0].get<std::string>();
            return suffix.length() <= str.length() && std::equal(suffix.rbegin(), suffix.rend(), str.rbegin());
          } else if (method->get_name() == "title") {
            vargs.expectArgs("title method", {0, 0}, {0, 0});
            auto res = str;
            for (size_t i = 0, n = res.size(); i < n; ++i) {
              if (i == 0 || std::isspace(res[i - 1])) res[i] = std::toupper(res[i]);
              else res[i] = std::tolower(res[i]);
            }
            return res;
          }
        }
        throw std::runtime_error("Unknown method: " + method->get_name());
    }